

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

int __thiscall HistogramBasedDistribution::getMedian(HistogramBasedDistribution *this)

{
  pointer ppVar1;
  pointer ppVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  ppVar1 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = 1;
  dVar10 = 0.0;
  ppVar2 = ppVar1;
  do {
    dVar9 = dVar10;
    iVar5 = this->max;
    if (uVar4 < (ulong)((long)(this->values).
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4)) {
      iVar5 = ppVar2[1].first + -1;
    }
    piVar3 = &ppVar2->first;
    dVar8 = (double)((iVar5 - *piVar3) + 1);
    dVar7 = ppVar2->second * dVar8;
    dVar10 = dVar9 + dVar7;
    uVar4 = uVar4 + 1;
    ppVar2 = ppVar2 + 1;
  } while (dVar10 < 0.5);
  fVar6 = roundf((float)(((0.5 - dVar9) * dVar8) / dVar7 + (double)*piVar3));
  return (int)fVar6;
}

Assistant:

int HistogramBasedDistribution::getMedian() {
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p >= 0.5) {
			return (int)roundf(start + ((double)length)*(0.5-p_sum)/p);
		}
		p_sum += p;
	}
	assert(false);
}